

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::add(parser *this,string *name,char short_name,string *desc)

{
  size_type sVar1;
  cmdline_error *this_00;
  mapped_type __x;
  mapped_type *ppoVar2;
  string *in_RDI;
  string *in_stack_ffffffffffffff98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffb7;
  string *in_stack_ffffffffffffffb8;
  option_without_value *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (sVar1 != 0) {
    this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    cmdline_error::cmdline_error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  __x = (mapped_type)operator_new(0x58);
  option_without_value::option_without_value
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,in_RDI);
  ppoVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                          *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *ppoVar2 = __x;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
             *)in_stack_ffffffffffffffa0,(value_type *)__x);
  return;
}

Assistant:

void add(const std::string& name, char short_name = 0, const std::string& desc = "") {
        if (options.count(name)) throw cmdline_error("multiple definition: " + name);
        options[name] = new option_without_value(name, short_name, desc);
        ordered.push_back(options[name]);
    }